

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall
icu_63::FixedDecimal::adjustForMinFractionDigits(FixedDecimal *this,int32_t minFractionDigits)

{
  int iVar1;
  int local_1c;
  int32_t i;
  int32_t numTrailingFractionZeros;
  int32_t minFractionDigits_local;
  FixedDecimal *this_local;
  
  iVar1 = minFractionDigits - this->visibleDecimalDigitCount;
  if (0 < iVar1) {
    local_1c = 0;
    while ((local_1c < iVar1 && (this->decimalDigits < 100000000000000000))) {
      this->decimalDigits = this->decimalDigits * 10;
      local_1c = local_1c + 1;
    }
    this->visibleDecimalDigitCount = iVar1 + this->visibleDecimalDigitCount;
  }
  return;
}

Assistant:

void FixedDecimal::adjustForMinFractionDigits(int32_t minFractionDigits) {
    int32_t numTrailingFractionZeros = minFractionDigits - visibleDecimalDigitCount;
    if (numTrailingFractionZeros > 0) {
        for (int32_t i=0; i<numTrailingFractionZeros; i++) {
            // Do not let the decimalDigits value overflow if there are many trailing zeros.
            // Limit the value to 18 digits, the most that a 64 bit int can fully represent.
            if (decimalDigits >= 100000000000000000LL) {
                break;
            }
            decimalDigits *= 10;
        }
        visibleDecimalDigitCount += numTrailingFractionZeros;
    }
}